

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# W_final.cpp
# Opt level: O2

void __thiscall W_final::space_allocation(W_final *this)

{
  long lVar1;
  minimum_fold *pmVar2;
  s_energy_matrix *this_00;
  pseudo_loop *this_01;
  minimum_fold *pmVar3;
  ulong uVar4;
  string local_98;
  string local_78;
  string local_58;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  lVar1 = (long)this->n;
  uVar4 = 0xffffffffffffffff;
  if (-2 < lVar1) {
    uVar4 = lVar1 * 4 + 4;
  }
  pmVar2 = (minimum_fold *)operator_new__(uVar4);
  if ((int)(lVar1 + 1) != 0) {
    pmVar3 = pmVar2;
    do {
      pmVar3->pair = -1;
      pmVar3->type = 'N';
      pmVar3 = pmVar3 + 1;
    } while (pmVar3 != pmVar2 + lVar1 + 1);
  }
  this->f = pmVar2;
  this_00 = (s_energy_matrix *)operator_new(0xb8);
  std::__cxx11::string::string((string *)&local_58,(string *)&this->seq_);
  s_energy_matrix::s_energy_matrix(this_00,&local_58,this->n,this->S_,this->S1_,this->params_);
  this->V = this_00;
  std::__cxx11::string::~string((string *)&local_58);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct((ulong)local_38,(char)this->n + '\x01');
  std::__cxx11::string::operator=((string *)&this->structure,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  this_01 = (pseudo_loop *)operator_new(0x188);
  std::__cxx11::string::string((string *)&local_78,(string *)&this->seq_);
  std::__cxx11::string::string((string *)&local_98,(string *)&this->res);
  pseudo_loop::pseudo_loop(this_01,&local_78,&local_98,this->V,this->S_,this->S1_,this->params_);
  this->WMB = this_01;
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void W_final::space_allocation(){

	// From simfold
	f = new minimum_fold [n+1];

    V = new s_energy_matrix (seq_, n,S_,S1_,params_);
	structure = std::string (n+1,'.');

	// Hosna: June 20th 2007
    WMB = new pseudo_loop (seq_,res,V,S_,S1_,params_);

}